

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  byte bVar1;
  dohdata *pdVar2;
  sockaddr *psVar3;
  undefined8 uVar4;
  DOHcode DVar5;
  CURLcode CVar6;
  uchar *puVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  Curl_addrinfo *pCVar12;
  Curl_dns_entry *pCVar13;
  sa_family_t sVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  ushort uVar18;
  uint uVar19;
  long lVar20;
  Curl_addrinfo *pCVar21;
  ushort uVar22;
  Curl_addrinfo *addr;
  dynbuf *s_00;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  dohentry *s_01;
  ushort uVar27;
  ulong uVar28;
  anon_union_16_2_f9ece763_for_ip *paVar29;
  bool bVar30;
  DOHcode rc [2];
  uint local_328 [2];
  char local_31e [126];
  dohentry de;
  
  pdVar2 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar2 == (dohdata *)0x0) {
LAB_00115c78:
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((pdVar2->probe[0].easy == (CURL *)0x0) && (pdVar2->probe[1].easy == (CURL *)0x0)) {
      Curl_failf(data,"Could not DOH-resolve: %s",(data->state).async.hostname);
      return (((data->conn->bits).field_0x5 & 4) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (pdVar2->pending != 0) {
      return CURLE_OK;
    }
    rc[0] = DOH_OK;
    rc[1] = DOH_OK;
    for (lVar20 = 8; lVar20 != 0x478; lVar20 = lVar20 + 0x238) {
      curl_multi_remove_handle
                (data->multi,*(Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar20 + -0x14));
      Curl_close((Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar20 + -0x14));
    }
    memset(&de,0,0x270);
    de.ttl = 0x7fffffff;
    for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
      Curl_dyn_init((dynbuf *)((long)&de.cname[0].bufr + lVar20),0x100);
    }
    lVar20 = 0;
LAB_00115374:
    if (lVar20 != 2) {
      if (pdVar2->probe[lVar20].dnstype != 0) {
        s = &pdVar2->probe[lVar20].serverdoh;
        puVar7 = Curl_dyn_uptr(s);
        sVar8 = Curl_dyn_len(s);
        uVar25 = pdVar2->probe[lVar20].dnstype;
        local_328[0] = 0xc;
        DVar5 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < sVar8) && (DVar5 = DOH_DNS_BAD_ID, puVar7 != (uchar *)0x0)) &&
            (*puVar7 == '\0')) &&
           ((puVar7[1] == '\0' && (DVar5 = DOH_DNS_BAD_RCODE, (puVar7[3] & 0xf) == 0)))) {
          uVar27 = *(ushort *)(puVar7 + 4) << 8 | *(ushort *)(puVar7 + 4) >> 8;
          sVar26 = 0xc;
          uVar19 = local_328[0];
          do {
            local_328[0] = uVar19;
            bVar30 = uVar27 == 0;
            uVar27 = uVar27 - 1;
            if (bVar30) {
              uVar27 = *(ushort *)(puVar7 + 6) << 8 | *(ushort *)(puVar7 + 6) >> 8;
              uVar22 = 0;
              uVar19 = local_328[0];
              goto LAB_00115468;
            }
            DVar5 = skipqname(puVar7,sVar8,local_328);
            if (DVar5 != DOH_OK) goto LAB_00115824;
            sVar26 = (size_t)(local_328[0] + 4);
            uVar19 = local_328[0] + 4;
          } while (sVar26 <= sVar8);
          DVar5 = DOH_DNS_OUT_OF_RANGE;
        }
        goto LAB_00115824;
      }
      goto LAB_00115885;
    }
    CVar6 = CURLE_COULDNT_RESOLVE_HOST;
    if ((rc[0] == DOH_OK) || (rc[1] == DOH_OK)) {
      Curl_infof(data,"DOH Host name: %s",pdVar2->host);
      puVar7 = de.addr[0].ip.v4 + 1;
      Curl_infof(data,"TTL: %u seconds",(ulong)de.ttl);
      for (lVar20 = 0; lVar20 < de.numaddr; lVar20 = lVar20 + 1) {
        iVar15 = de.addr[lVar20].type;
        if (iVar15 == 0x1c) {
          curl_msnprintf((char *)local_328,0x80,"DOH AAAA: ");
          pcVar16 = local_31e;
          sVar8 = 0x76;
          for (uVar28 = 0; uVar28 < 0x10; uVar28 = uVar28 + 2) {
            pcVar17 = ":";
            if (uVar28 == 0) {
              pcVar17 = "";
            }
            curl_msnprintf(pcVar16,sVar8,"%s%02x%02x",pcVar17,(ulong)puVar7[uVar28 - 1],
                           (ulong)puVar7[uVar28]);
            sVar11 = strlen(pcVar16);
            sVar8 = sVar8 - sVar11;
            pcVar16 = pcVar16 + sVar11;
          }
          Curl_infof(data,"%s",local_328);
        }
        else if (iVar15 == 1) {
          Curl_infof(data,"DOH A: %u.%u.%u.%u",(ulong)de.addr[lVar20].ip.v4[0],
                     (ulong)de.addr[lVar20].ip.v4[1],(ulong)de.addr[lVar20].ip.v4[2],
                     (ulong)de.addr[lVar20].ip.v4[3]);
        }
        puVar7 = puVar7 + 0x14;
      }
      s_01 = &de;
      for (lVar20 = 0; lVar20 < de.numcname; lVar20 = lVar20 + 1) {
        pcVar16 = Curl_dyn_ptr(s_01->cname);
        Curl_infof(data,"CNAME: %s",pcVar16);
        s_01 = (dohentry *)(s_01->cname + 1);
      }
      pcVar16 = pdVar2->host;
      uVar27 = (ushort)pdVar2->port;
      sVar11 = strlen(pcVar16);
      paVar29 = &de.addr[0].ip;
      addr = (Curl_addrinfo *)0x0;
      pCVar21 = (Curl_addrinfo *)0x0;
      for (lVar20 = 0; lVar20 < de.numaddr; lVar20 = lVar20 + 1) {
        iVar15 = ((dohaddr *)((long)paVar29 + -4))->type;
        lVar9 = 0x1c;
        if (iVar15 != 0x1c) {
          lVar9 = 0x10;
        }
        pCVar12 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar11 + 0x31 + lVar9);
        if (pCVar12 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(addr);
          goto LAB_00115c6b;
        }
        pCVar12->ai_addr = (sockaddr *)(pCVar12 + 1);
        pcVar17 = (char *)((long)&pCVar12[1].ai_flags + lVar9);
        pCVar12->ai_canonname = pcVar17;
        memcpy(pcVar17,pcVar16,sVar11 + 1);
        if (addr == (Curl_addrinfo *)0x0) {
          addr = pCVar12;
        }
        if (pCVar21 != (Curl_addrinfo *)0x0) {
          pCVar21->ai_next = pCVar12;
        }
        pCVar12->ai_family = (uint)(iVar15 == 0x1c) * 8 + 2;
        pCVar12->ai_socktype = 1;
        pCVar12->ai_addrlen = (curl_socklen_t)lVar9;
        psVar3 = pCVar12->ai_addr;
        if (iVar15 == 0x1c) {
          uVar4 = *(undefined8 *)((long)paVar29 + 8);
          *(undefined8 *)(psVar3->sa_data + 6) = *(undefined8 *)paVar29;
          psVar3[1].sa_family = (short)uVar4;
          psVar3[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
          psVar3[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
          psVar3[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
          psVar3[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
          psVar3[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
          psVar3[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
          sVar14 = 10;
        }
        else {
          *(undefined4 *)(psVar3->sa_data + 2) = *(undefined4 *)paVar29;
          sVar14 = 2;
        }
        psVar3->sa_family = sVar14;
        *(ushort *)psVar3->sa_data = uVar27 << 8 | uVar27 >> 8;
        paVar29 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar29 + 0x14);
        pCVar21 = pCVar12;
      }
      if (addr == (Curl_addrinfo *)0x0) {
LAB_00115c6b:
        de_cleanup(&de);
        goto LAB_00115c78;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar13 = Curl_cache_addr(data,addr,pdVar2->host,pdVar2->port);
      CVar6 = CURLE_COULDNT_RESOLVE_HOST;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar13 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
      }
      else {
        (data->state).async.dns = pCVar13;
        *dnsp = pCVar13;
        CVar6 = CURLE_OK;
      }
    }
    de_cleanup(&de);
    (*Curl_cfree)((data->req).doh);
    (data->req).doh = (dohdata *)0x0;
  }
  return CVar6;
LAB_00115468:
  do {
    local_328[0] = uVar19;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      uVar27 = *(ushort *)(puVar7 + 8) << 8 | *(ushort *)(puVar7 + 8) >> 8;
      uVar25 = local_328[0];
      goto LAB_00115724;
    }
    DVar5 = skipqname(puVar7,sVar8,local_328);
    if (DVar5 != DOH_OK) goto LAB_00115824;
    if (sVar8 < local_328[0] + 2) goto LAB_00115820;
    uVar22 = *(ushort *)(puVar7 + (int)local_328[0]) << 8 |
             *(ushort *)(puVar7 + (int)local_328[0]) >> 8;
    uVar24 = (uint)uVar22;
    if (((uVar22 != 5) && (uVar24 != 0x27)) && (uVar25 != uVar24)) {
      DVar5 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_00115824;
    }
    if (sVar8 < local_328[0] + 4) goto LAB_00115820;
    if ((ushort)(*(ushort *)(puVar7 + (int)(local_328[0] + 2)) << 8 |
                *(ushort *)(puVar7 + (int)(local_328[0] + 2)) >> 8) != 1) {
      DVar5 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_00115824;
    }
    if (sVar8 < local_328[0] + 8) goto LAB_00115820;
    uVar19 = *(uint *)(puVar7 + (int)(local_328[0] + 4));
    uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    if (uVar19 < de.ttl) {
      de.ttl = uVar19;
    }
    uVar23 = local_328[0] + 10;
    uVar28 = (ulong)uVar23;
    if (sVar8 < uVar28) goto LAB_00115820;
    uVar18 = *(ushort *)(puVar7 + (int)(local_328[0] + 8)) << 8 |
             *(ushort *)(puVar7 + (int)(local_328[0] + 8)) >> 8;
    uVar19 = uVar18 + uVar23;
    sVar26 = (size_t)uVar19;
    if (sVar8 < sVar26) goto LAB_00115820;
    if (uVar22 == 0x1c) {
      if (uVar18 != 0x10) {
LAB_001157a7:
        DVar5 = DOH_DNS_RDATA_LEN;
        goto LAB_00115824;
      }
      lVar9 = (long)de.numaddr;
      if (lVar9 < 0x18) {
        de.addr[lVar9].type = 0x1c;
        uVar4 = *(undefined8 *)(puVar7 + (int)uVar23 + 8);
        *(undefined8 *)&de.addr[lVar9].ip = *(undefined8 *)(puVar7 + (int)uVar23);
        *(undefined8 *)((long)&de.addr[lVar9].ip + 8) = uVar4;
LAB_001156e9:
        de.numaddr = de.numaddr + 1;
      }
      goto LAB_00115468;
    }
    if (uVar24 != 5) {
      if (uVar24 == 1) {
        if (uVar18 != 4) goto LAB_001157a7;
        lVar9 = (long)de.numaddr;
        if (lVar9 < 0x18) {
          de.addr[lVar9].type = 1;
          *(undefined4 *)&de.addr[lVar9].ip = *(undefined4 *)(puVar7 + (int)uVar23);
          goto LAB_001156e9;
        }
      }
      goto LAB_00115468;
    }
    lVar9 = (long)de.numcname;
    if (lVar9 == 4) goto LAB_00115468;
    de.numcname = de.numcname + 1;
    s_00 = de.cname + lVar9;
    iVar15 = -0x7f;
    do {
      if (sVar8 <= uVar28) goto LAB_00115820;
      bVar1 = puVar7[uVar28];
      if ((bVar1 & 0xc0) == 0) {
        uVar24 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar24;
        if ((ulong)bVar1 != 0) {
          sVar10 = Curl_dyn_len(s_00);
          if ((sVar10 == 0) || (CVar6 = Curl_dyn_add(s_00,"."), CVar6 == CURLE_OK)) {
            uVar28 = (ulong)(bVar1 + uVar24);
            if (sVar8 < uVar28) goto LAB_0011579f;
            CVar6 = Curl_dyn_addn(s_00,puVar7 + uVar24,(ulong)bVar1);
            if (CVar6 == CURLE_OK) goto LAB_001156a0;
          }
          DVar5 = DOH_OUT_OF_MEM;
          goto LAB_00115824;
        }
      }
      else {
        if ((bVar1 & 0xc0) != 0xc0) {
LAB_0011579f:
          DVar5 = DOH_DNS_BAD_LABEL;
          goto LAB_00115824;
        }
        uVar28 = (ulong)((int)uVar28 + 1);
        if (sVar8 <= uVar28) goto LAB_00115820;
        uVar28 = (ulong)((uint)puVar7[uVar28] | (bVar1 & 0x3f) << 8);
      }
LAB_001156a0:
    } while ((bVar1 != 0) && (bVar30 = iVar15 != 0, iVar15 = iVar15 + 1, bVar30));
  } while (bVar1 == 0);
  DVar5 = DOH_DNS_LABEL_LOOP;
  goto LAB_00115824;
  while( true ) {
    uVar25 = (uint)(ushort)(*(ushort *)(puVar7 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar7 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar26 = (size_t)uVar25;
    if (sVar8 < sVar26) break;
LAB_00115724:
    local_328[0] = uVar25;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      uVar27 = *(ushort *)(puVar7 + 10) << 8 | *(ushort *)(puVar7 + 10) >> 8;
      uVar25 = local_328[0];
      goto LAB_001157b8;
    }
    DVar5 = skipqname(puVar7,sVar8,local_328);
    if (DVar5 != DOH_OK) goto LAB_00115824;
    if ((sVar8 < local_328[0] + 8) || (sVar8 < local_328[0] + 10)) break;
  }
  goto LAB_00115820;
  while( true ) {
    uVar25 = (uint)(ushort)(*(ushort *)(puVar7 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar7 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar26 = (size_t)uVar25;
    if (sVar8 < sVar26) break;
LAB_001157b8:
    local_328[0] = uVar25;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      DVar5 = DOH_DNS_MALFORMAT;
      if (sVar8 == sVar26) {
        DVar5 = DOH_OK;
        if (de.numaddr == 0 && de.numcname == 0) {
          DVar5 = DOH_NO_CONTENT;
        }
        if (uVar22 == 2) {
          DVar5 = DOH_OK;
        }
      }
      goto LAB_00115824;
    }
    DVar5 = skipqname(puVar7,sVar8,local_328);
    if (DVar5 != DOH_OK) goto LAB_00115824;
    if ((sVar8 < local_328[0] + 8) || (sVar8 < local_328[0] + 10)) break;
  }
LAB_00115820:
  DVar5 = DOH_DNS_OUT_OF_RANGE;
LAB_00115824:
  rc[lVar20] = DVar5;
  Curl_dyn_free(s);
  if (DVar5 != DOH_OK) {
    pcVar16 = "AAAA";
    if (pdVar2->probe[lVar20].dnstype == 1) {
      pcVar16 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar5],
               pcVar16,pdVar2->host);
  }
LAB_00115885:
  lVar20 = lVar20 + 1;
  goto LAB_00115374;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DOH-resolve: %s", data->state.async.hostname);
    return data->conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DOH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DOH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DOH transactions to complete */
  return CURLE_OK;
}